

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O2

double StrToD(char *str,int flags,double empty_string_value,int *processed_characters_count,
             bool *processed_all,uc16 separator)

{
  double value;
  size_t sVar1;
  ulong uVar2;
  uint *processed_characters_count_00;
  ulong uVar3;
  uint value_00;
  bool processed_all16;
  int processed_characters_count16;
  uc16 buffer16 [256];
  bool local_281;
  double local_280;
  double local_278;
  uint local_26c;
  StringToDoubleConverter local_268;
  uc16 local_238 [260];
  
  local_268.junk_string_value_ = NAN;
  local_268.infinity_symbol_ = (char *)0x0;
  local_268.nan_symbol_ = (char *)0x0;
  local_278 = empty_string_value;
  local_268.flags_ = flags;
  local_268.empty_string_value_ = empty_string_value;
  local_268.separator_ = separator;
  sVar1 = strlen(str);
  local_280 = double_conversion::StringToDoubleConverter::StringToDouble
                        (&local_268,str,(int)sVar1,processed_characters_count);
  sVar1 = strlen(str);
  *processed_all = sVar1 == (uint)*processed_characters_count;
  sVar1 = strlen(str);
  uVar2 = 0;
  uVar3 = 0;
  if (0 < (int)sVar1) {
    uVar3 = sVar1 & 0xffffffff;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    local_238[uVar2] = (short)str[uVar2];
  }
  value_00 = (uint)separator;
  processed_characters_count_00 = &local_26c;
  value = StrToD16(local_238,(int)sVar1,flags,local_278,(int *)processed_characters_count_00,
                   &local_281,separator);
  CheckEqualsHelper((char *)0x767,0xc13527,"result16",local_280,
                    (char *)processed_characters_count_00,value);
  CheckEqualsHelper((char *)0x768,0xc13537,(char *)(ulong)(uint)*processed_characters_count,0xc13553
                    ,(char *)(ulong)local_26c,value_00);
  return local_280;
}

Assistant:

static double StrToD(const char* str, int flags, double empty_string_value,
                     int* processed_characters_count, bool* processed_all,
                     uc16 separator = StringToDoubleConverter::kNoSeparator) {
  StringToDoubleConverter converter(flags, empty_string_value, Double::NaN(),
                                    NULL, NULL, separator);
  double result = converter.StringToDouble(str, strlen(str),
                                           processed_characters_count);
  *processed_all =
      ((strlen(str) == static_cast<unsigned>(*processed_characters_count)));

  uc16 buffer16[256];
  DOUBLE_CONVERSION_ASSERT(strlen(str) < DOUBLE_CONVERSION_ARRAY_SIZE(buffer16));
  int len = strlen(str);
  for (int i = 0; i < len; i++) {
    buffer16[i] = str[i];
  }
  int processed_characters_count16;
  bool processed_all16;
  double result16 = StrToD16(buffer16, len, flags, empty_string_value,
                             &processed_characters_count16, &processed_all16,
                             separator);
  CHECK_EQ(result, result16);
  CHECK_EQ(*processed_characters_count, processed_characters_count16);
  return result;
}